

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

void __thiscall
ON_OBSOLETE_V5_DimExtra::SetArrowPosition(ON_OBSOLETE_V5_DimExtra *this,int position)

{
  if (0 < position) {
    this->m_arrow_position = 1;
    return;
  }
  if (-1 < position) {
    this->m_arrow_position = 0;
    return;
  }
  this->m_arrow_position = -1;
  return;
}

Assistant:

void ON_OBSOLETE_V5_DimExtra::SetArrowPosition( int position)
{
  if( position > 0)
    m_arrow_position = 1;
  else if( position < 0)
    m_arrow_position = -1;
  else
    m_arrow_position = 0;
}